

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

SrcList * sqlite3SrcListEnlarge(Parse *pParse,SrcList *pSrc,int nExtra,int iStart)

{
  bool bVar1;
  SrcList *pSVar2;
  SrcItem *pSVar3;
  uint uVar4;
  long lVar5;
  int *piVar6;
  SrcItem *pSVar7;
  SrcItem *pSVar8;
  SrcItem *pSVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  byte bVar13;
  
  bVar13 = 0;
  uVar4 = pSrc->nSrc + nExtra;
  lVar12 = (long)nExtra;
  if (pSrc->nAlloc < uVar4) {
    if ((int)uVar4 < 200) {
      lVar10 = lVar12 + (long)pSrc->nSrc * 2;
      lVar11 = 200;
      if (lVar10 < 200) {
        lVar11 = lVar10;
      }
      pSVar2 = (SrcList *)sqlite3DbRealloc(pParse->db,pSrc,lVar11 * 0x68 + 8);
      if (pSVar2 == (SrcList *)0x0) {
        bVar1 = false;
      }
      else {
        pSVar2->nAlloc = (u32)lVar11;
        bVar1 = true;
        pSrc = pSVar2;
      }
    }
    else {
      bVar1 = false;
      sqlite3ErrorMsg(pParse,"too many FROM clause terms, max: %d",200);
    }
    if (!bVar1) {
      return (SrcList *)0x0;
    }
  }
  lVar10 = (long)pSrc->nSrc;
  lVar11 = (long)iStart;
  if (iStart < pSrc->nSrc) {
    pSVar3 = pSrc->a + lVar10 + -1;
    pSVar7 = pSrc->a + lVar10 + lVar12 + -1;
    do {
      lVar10 = lVar10 + -1;
      pSVar8 = pSVar3;
      pSVar9 = pSVar7;
      for (lVar5 = 0xd; lVar5 != 0; lVar5 = lVar5 + -1) {
        pSVar9->pSchema = pSVar8->pSchema;
        pSVar8 = (SrcItem *)((long)pSVar8 + ((ulong)bVar13 * -2 + 1) * 8);
        pSVar9 = (SrcItem *)((long)pSVar9 + ((ulong)bVar13 * -2 + 1) * 8);
      }
      pSVar3 = pSVar3 + -1;
      pSVar7 = pSVar7 + -1;
    } while (iStart < lVar10);
  }
  pSrc->nSrc = pSrc->nSrc + nExtra;
  memset(pSrc->a + lVar11,0,lVar12 * 0x68);
  if (0 < nExtra) {
    piVar6 = &pSrc->a[lVar11].iCursor;
    do {
      *piVar6 = -1;
      lVar11 = lVar11 + 1;
      piVar6 = piVar6 + 0x1a;
    } while (lVar11 < iStart + nExtra);
  }
  return pSrc;
}

Assistant:

SQLITE_PRIVATE SrcList *sqlite3SrcListEnlarge(
  Parse *pParse,     /* Parsing context into which errors are reported */
  SrcList *pSrc,     /* The SrcList to be enlarged */
  int nExtra,        /* Number of new slots to add to pSrc->a[] */
  int iStart         /* Index in pSrc->a[] of first new slot */
){
  int i;

  /* Sanity checking on calling parameters */
  assert( iStart>=0 );
  assert( nExtra>=1 );
  assert( pSrc!=0 );
  assert( iStart<=pSrc->nSrc );

  /* Allocate additional space if needed */
  if( (u32)pSrc->nSrc+nExtra>pSrc->nAlloc ){
    SrcList *pNew;
    sqlite3_int64 nAlloc = 2*(sqlite3_int64)pSrc->nSrc+nExtra;
    sqlite3 *db = pParse->db;

    if( pSrc->nSrc+nExtra>=SQLITE_MAX_SRCLIST ){
      sqlite3ErrorMsg(pParse, "too many FROM clause terms, max: %d",
                      SQLITE_MAX_SRCLIST);
      return 0;
    }
    if( nAlloc>SQLITE_MAX_SRCLIST ) nAlloc = SQLITE_MAX_SRCLIST;
    pNew = sqlite3DbRealloc(db, pSrc,
               sizeof(*pSrc) + (nAlloc-1)*sizeof(pSrc->a[0]) );
    if( pNew==0 ){
      assert( db->mallocFailed );
      return 0;
    }
    pSrc = pNew;
    pSrc->nAlloc = nAlloc;
  }

  /* Move existing slots that come after the newly inserted slots
  ** out of the way */
  for(i=pSrc->nSrc-1; i>=iStart; i--){
    pSrc->a[i+nExtra] = pSrc->a[i];
  }
  pSrc->nSrc += nExtra;

  /* Zero the newly allocated slots */
  memset(&pSrc->a[iStart], 0, sizeof(pSrc->a[0])*nExtra);
  for(i=iStart; i<iStart+nExtra; i++){
    pSrc->a[i].iCursor = -1;
  }

  /* Return a pointer to the enlarged SrcList */
  return pSrc;
}